

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::addError
          (CompilerMain *this,ReadableDirectory *directory,PathPtr path,SourcePos start,
          SourcePos end,StringPtr message)

{
  ProcessContext *pPVar1;
  uint uVar2;
  char (*in_stack_fffffffffffffea0) [2];
  char (*in_stack_fffffffffffffeb0) [2];
  char (*in_stack_fffffffffffffec0) [2];
  StringPtr local_118;
  int local_104;
  String local_100;
  int local_e4;
  int local_e0;
  int local_dc;
  String local_d8;
  int local_c0;
  int local_bc;
  String local_b8;
  undefined1 local_90 [8];
  String wholeMessage;
  undefined1 local_60 [8];
  String file;
  ReadableDirectory *directory_local;
  CompilerMain *this_local;
  uint uStack_24;
  SourcePos start_local;
  PathPtr path_local;
  
  uVar2 = start.column;
  wholeMessage.content.disposer = (ArrayDisposer *)path.parts.ptr;
  file.content.disposer = (ArrayDisposer *)directory;
  getDisplayName((String *)local_60,this,directory,path);
  kj::String::String((String *)local_90);
  uStack_24 = start.line;
  if (end.line == uStack_24) {
    if (end.column == uVar2) {
      local_bc = uStack_24 + 1;
      local_c0 = uVar2 + 1;
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                (&local_b8,(kj *)local_60,(String *)0x3c5b58,(char (*) [2])&local_bc,
                 (uint *)0x3c5b58,(char (*) [2])&local_c0,(uint *)": error: ",
                 (char (*) [10])&message,(StringPtr *)0x3c40c3,in_stack_fffffffffffffeb0);
      kj::String::operator=((String *)local_90,&local_b8);
      kj::String::~String(&local_b8);
    }
    else {
      local_dc = uStack_24 + 1;
      local_e0 = uVar2 + 1;
      local_e4 = end.column + 1;
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                (&local_d8,(kj *)local_60,(String *)0x3c5b58,(char (*) [2])&local_dc,
                 (uint *)0x3c5b58,(char (*) [2])&local_e0,(uint *)0x3c3ed5,(char (*) [2])&local_e4,
                 (uint *)": error: ",(char (*) [10])&message,(StringPtr *)0x3c40c3,
                 in_stack_fffffffffffffec0);
      kj::String::operator=((String *)local_90,&local_d8);
      kj::String::~String(&local_d8);
    }
  }
  else {
    local_104 = uStack_24 + 1;
    kj::
    str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
              (&local_100,(kj *)local_60,(String *)0x3c5b58,(char (*) [2])&local_104,
               (uint *)": error: ",(char (*) [10])&message,(StringPtr *)0x3c40c3,
               in_stack_fffffffffffffea0);
    kj::String::operator=((String *)local_90,&local_100);
    kj::String::~String(&local_100);
  }
  pPVar1 = this->context;
  kj::StringPtr::StringPtr(&local_118,(String *)local_90);
  (*pPVar1->_vptr_ProcessContext[3])(pPVar1,local_118.content.ptr,local_118.content.size_);
  this->hadErrors_ = true;
  kj::String::~String((String *)local_90);
  kj::String::~String((String *)local_60);
  return;
}

Assistant:

void addError(const kj::ReadableDirectory& directory, kj::PathPtr path,
                SourcePos start, SourcePos end,
                kj::StringPtr message) override {
    auto file = getDisplayName(directory, path);

    kj::String wholeMessage;
    if (end.line == start.line) {
      if (end.column == start.column) {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               ": error: ", message, "\n");
      } else {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               "-", end.column + 1, ": error: ", message, "\n");
      }
    } else {
      // The error spans multiple lines, so just report it on the first such line.
      wholeMessage = kj::str(file, ":", start.line + 1, ": error: ", message, "\n");
    }

    context.error(wholeMessage);
    hadErrors_ = true;
  }